

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssimpCExport.cpp
# Opt level: O2

aiExportFormatDesc * aiGetExportFormatDescription(size_t index)

{
  char *pcVar1;
  aiExportFormatDesc *paVar2;
  aiExportFormatDesc *paVar3;
  size_t sVar4;
  char *pcVar5;
  Exporter exporter;
  
  Assimp::Exporter::Exporter(&exporter);
  paVar2 = Assimp::Exporter::GetExportFormatDescription(&exporter,index);
  if (paVar2 == (aiExportFormatDesc *)0x0) {
    paVar3 = (aiExportFormatDesc *)0x0;
  }
  else {
    paVar3 = (aiExportFormatDesc *)operator_new(0x18);
    pcVar1 = paVar2->description;
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)operator_new__(sVar4 + 1);
    memset(pcVar5,0,sVar4 + 1);
    paVar3->description = pcVar5;
    sVar4 = strlen(pcVar1);
    strncpy(pcVar5,pcVar1,sVar4);
    pcVar1 = paVar2->fileExtension;
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)operator_new__(sVar4 + 1);
    memset(pcVar5,0,sVar4 + 1);
    paVar3->fileExtension = pcVar5;
    sVar4 = strlen(pcVar1);
    strncpy(pcVar5,pcVar1,sVar4);
    pcVar1 = paVar2->id;
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)operator_new__(sVar4 + 1);
    memset(pcVar5,0,sVar4 + 1);
    paVar3->id = pcVar5;
    sVar4 = strlen(pcVar1);
    strncpy(pcVar5,pcVar1,sVar4);
  }
  Assimp::Exporter::~Exporter(&exporter);
  return paVar3;
}

Assistant:

ASSIMP_API const aiExportFormatDesc* aiGetExportFormatDescription( size_t index)
{
    // Note: this is valid as the index always pertains to a built-in exporter,
    // for which the returned structure is guaranteed to be of static storage duration.
    Exporter exporter;
    const aiExportFormatDesc* orig( exporter.GetExportFormatDescription( index ) );
    if (NULL == orig) {
        return NULL;
    }

    aiExportFormatDesc *desc = new aiExportFormatDesc;
    desc->description = new char[ strlen( orig->description ) + 1 ]();
    ::strncpy( (char*) desc->description, orig->description, strlen( orig->description ) );
    desc->fileExtension = new char[ strlen( orig->fileExtension ) + 1 ]();
    ::strncpy( ( char* ) desc->fileExtension, orig->fileExtension, strlen( orig->fileExtension ) );
    desc->id = new char[ strlen( orig->id ) + 1 ]();
    ::strncpy( ( char* ) desc->id, orig->id, strlen( orig->id ) );

    return desc;
}